

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

Vec_Int_t * Gia_ManEdgeToArray(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  long lVar3;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x5c,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
  }
  if (p->vEdge1->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x5d,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
  }
  if (p->vEdge2->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x5e,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
  }
  if (0 < p->nObjs) {
    lVar3 = 0;
    do {
      if (p->vEdge1->nSize <= lVar3) {
LAB_001f6d76:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vEdge1->pArray[lVar3];
      if (iVar1 < lVar3 && (long)iVar1 != 0) {
        Vec_IntPush(p_00,iVar1);
        Vec_IntPush(p_00,(int)lVar3);
      }
      if (p->vEdge2->nSize <= lVar3) goto LAB_001f6d76;
      iVar1 = p->vEdge2->pArray[lVar3];
      if (iVar1 < lVar3 && (long)iVar1 != 0) {
        Vec_IntPush(p_00,iVar1);
        Vec_IntPush(p_00,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManEdgeToArray( Gia_Man_t * p )
{
    int iObj, iFanin;
    Vec_Int_t * vArray = Vec_IntAlloc( 1000 );
    assert( p->vEdge1 && p->vEdge2 );
    assert( Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p) );
    for ( iObj = 0; iObj < Gia_ManObjNum(p); iObj++ )
    {
        iFanin = Vec_IntEntry( p->vEdge1, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
        iFanin = Vec_IntEntry( p->vEdge2, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
    }
    return vArray;
}